

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue.h
# Opt level: O1

bool __thiscall CCheckQueue<CScriptCheck>::Loop(CCheckQueue<CScriptCheck> *this,bool fMaster)

{
  uint *puVar1;
  pointer pCVar2;
  pointer pCVar3;
  bool bVar4;
  CScriptCheck *pCVar5;
  pointer pCVar6;
  CScriptCheck *pCVar7;
  byte bVar8;
  uint uVar9;
  unique_lock *puVar10;
  CScriptCheck *check;
  CScriptCheck *this_00;
  undefined7 in_register_00000031;
  uint uVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  vector<CScriptCheck,_std::allocator<CScriptCheck>_> vChecks;
  UniqueLock<AnnotatedMixin<std::mutex>_> lock;
  uint local_88;
  vector<CScriptCheck,_std::allocator<CScriptCheck>_> local_68;
  unique_lock<std::mutex> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  puVar10 = (unique_lock *)&this->m_worker_cv;
  if ((int)CONCAT71(in_register_00000031,fMaster) != 0) {
    puVar10 = (unique_lock *)&this->m_master_cv;
  }
  local_68.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
  super__Vector_impl_data._M_start = (CScriptCheck *)0x0;
  local_68.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
  super__Vector_impl_data._M_finish = (CScriptCheck *)0x0;
  local_68.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<CScriptCheck,_std::allocator<CScriptCheck>_>::reserve
            (&local_68,(ulong)this->nBatchSize);
  uVar12 = 0;
  bVar8 = 1;
  local_88 = (uint)&this->queue;
  pCVar7 = local_68.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    local_68.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
    super__Vector_impl_data._M_finish = pCVar7;
    local_48._M_owns = false;
    local_48._M_device = (mutex_type *)this;
    std::unique_lock<std::mutex>::lock(&local_48);
    if ((int)uVar12 == 0) {
      this->nTotal = this->nTotal + 1;
    }
    else {
      this->fAllOk = (bool)(this->fAllOk & bVar8);
      puVar1 = &this->nTodo;
      *puVar1 = *puVar1 - (int)uVar12;
      if (*puVar1 == 0 && !fMaster) {
        std::condition_variable::notify_one();
      }
    }
    while( true ) {
      pCVar2 = (this->queue).super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl
               .super__Vector_impl_data._M_start;
      pCVar3 = (this->queue).super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl
               .super__Vector_impl_data._M_finish;
      if ((pCVar2 != pCVar3) || (this->m_request_stop != false)) break;
      if ((fMaster) && (this->nTodo == 0)) {
        this->nTotal = this->nTotal + -1;
        local_88 = (uint)this->fAllOk;
        this->fAllOk = true;
        bVar4 = false;
        goto LAB_0042b05b;
      }
      this->nIdle = this->nIdle + 1;
      std::condition_variable::wait(puVar10);
      this->nIdle = this->nIdle + -1;
    }
    if (this->m_request_stop == false) {
      uVar9 = (uint)((int)((ulong)((long)pCVar3 - (long)pCVar2) >> 4) * -0x33333333) /
              (this->nTotal + this->nIdle + 1U);
      uVar11 = this->nBatchSize;
      if (uVar9 < this->nBatchSize) {
        uVar11 = uVar9;
      }
      uVar12 = (ulong)(uVar11 + (uVar11 == 0));
      std::vector<CScriptCheck,std::allocator<CScriptCheck>>::
      _M_assign_aux<std::move_iterator<__gnu_cxx::__normal_iterator<CScriptCheck*,std::vector<CScriptCheck,std::allocator<CScriptCheck>>>>>
                ((vector<CScriptCheck,std::allocator<CScriptCheck>> *)&local_68,pCVar3 + -uVar12,
                 pCVar3);
      std::vector<CScriptCheck,_std::allocator<CScriptCheck>_>::_M_erase
                (&this->queue,pCVar3 + -uVar12,
                 (this->queue).super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      bVar8 = this->fAllOk;
      bVar4 = true;
    }
    else {
      bVar4 = false;
      local_88 = 0;
    }
LAB_0042b05b:
    std::unique_lock<std::mutex>::~unique_lock(&local_48);
    pCVar2 = local_68.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
             super__Vector_impl_data._M_finish;
    this_00 = local_68.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (!bVar4) {
      std::vector<CScriptCheck,_std::allocator<CScriptCheck>_>::~vector(&local_68);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return (bool)((byte)local_88 & 1);
    }
    for (; pCVar6 = local_68.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl
                    .super__Vector_impl_data._M_finish,
        pCVar3 = local_68.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
                 super__Vector_impl_data._M_start,
        pCVar5 = local_68.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
                 super__Vector_impl_data._M_start,
        pCVar7 = local_68.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
                 super__Vector_impl_data._M_finish, this_00 != pCVar2; this_00 = this_00 + 1) {
      if ((bVar8 & 1) != 0) {
        bVar8 = CScriptCheck::operator()(this_00);
      }
    }
    for (; pCVar6 != pCVar5; pCVar5 = pCVar5 + 1) {
      if (0x1c < (pCVar5->m_tx_out).scriptPubKey.super_CScriptBase._size) {
        free((pCVar5->m_tx_out).scriptPubKey.super_CScriptBase._union.indirect_contents.indirect);
        (pCVar5->m_tx_out).scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
             (char *)0x0;
      }
      pCVar7 = pCVar3;
    }
  } while( true );
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_mutex)
    {
        std::condition_variable& cond = fMaster ? m_master_cv : m_worker_cv;
        std::vector<T> vChecks;
        vChecks.reserve(nBatchSize);
        unsigned int nNow = 0;
        bool fOk = true;
        do {
            {
                WAIT_LOCK(m_mutex, lock);
                // first do the clean-up of the previous loop run (allowing us to do it in the same critsect)
                if (nNow) {
                    fAllOk &= fOk;
                    nTodo -= nNow;
                    if (nTodo == 0 && !fMaster)
                        // We processed the last element; inform the master it can exit and return the result
                        m_master_cv.notify_one();
                } else {
                    // first iteration
                    nTotal++;
                }
                // logically, the do loop starts here
                while (queue.empty() && !m_request_stop) {
                    if (fMaster && nTodo == 0) {
                        nTotal--;
                        bool fRet = fAllOk;
                        // reset the status for new work later
                        fAllOk = true;
                        // return the current status
                        return fRet;
                    }
                    nIdle++;
                    cond.wait(lock); // wait
                    nIdle--;
                }
                if (m_request_stop) {
                    return false;
                }

                // Decide how many work units to process now.
                // * Do not try to do everything at once, but aim for increasingly smaller batches so
                //   all workers finish approximately simultaneously.
                // * Try to account for idle jobs which will instantly start helping.
                // * Don't do batches smaller than 1 (duh), or larger than nBatchSize.
                nNow = std::max(1U, std::min(nBatchSize, (unsigned int)queue.size() / (nTotal + nIdle + 1)));
                auto start_it = queue.end() - nNow;
                vChecks.assign(std::make_move_iterator(start_it), std::make_move_iterator(queue.end()));
                queue.erase(start_it, queue.end());
                // Check whether we need to do work at all
                fOk = fAllOk;
            }
            // execute work
            for (T& check : vChecks)
                if (fOk)
                    fOk = check();
            vChecks.clear();
        } while (true);
    }